

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexNative_srell.h
# Opt level: O0

bool __thiscall
srell::regex_internal::re_compiler<char,_srell::u8regex_traits<char>_>::translate_atom_escape
          (re_compiler<char,_srell::u8regex_traits<char>_> *this,state_type *atom,uchar21 **curpos,
          uchar21 *end,re_compiler_state<char> *cstate)

{
  uchar21 uVar1;
  bool bVar2;
  bool local_45;
  re_compiler_state<char> *cstate_local;
  uchar21 *end_local;
  uchar21 **curpos_local;
  state_type *atom_local;
  re_compiler<char,_srell::u8regex_traits<char>_> *this_local;
  
  if (*curpos == end) {
    re_object_core<char,_srell::u8regex_traits<char>_>::throw_error
              (&this->super_re_object_core<char,_srell::u8regex_traits<char>_>,
               &regex_constants::error_escape);
  }
  (atom->field_0).character = **curpos;
  uVar1 = (atom->field_0).character;
  if (uVar1 == L'-') {
    re_object_core<char,_srell::u8regex_traits<char>_>::throw_error
              (&this->super_re_object_core<char,_srell::u8regex_traits<char>_>,
               &regex_constants::error_escape);
  }
  else if (uVar1 != L'B') {
    if (uVar1 != L'b') {
      if (uVar1 == L'k') {
        bVar2 = parse_backreference_name(this,atom,curpos,end,cstate);
        return bVar2;
      }
      if ((0x30 < (atom->field_0).number) && ((atom->field_0).number < 0x3a)) {
        bVar2 = parse_backreference_number(this,atom,curpos,end,cstate);
        return bVar2;
      }
      bVar2 = translate_escseq(this,atom,curpos,end);
      local_45 = false;
      if (bVar2) {
        local_45 = register_if_negatedcharclass(this,atom);
      }
      return local_45;
    }
    goto LAB_002ebcd9;
  }
  (atom->field_5).is_not = true;
LAB_002ebcd9:
  atom->type = st_boundary;
  re_quantifier::reset(&atom->quantifier,0);
  bVar2 = is_icase(this);
  if (bVar2) {
    re_character_class::setup_icase_word
              (&(this->super_re_object_core<char,_srell::u8regex_traits<char>_>).character_class);
    (atom->field_0).character = L'\x05';
  }
  else {
    (atom->field_0).character = L'\x04';
  }
  *curpos = *curpos + 1;
  return true;
}

Assistant:

bool translate_atom_escape(state_type &atom, const uchar21 *&curpos, const uchar21 *const end, /* const */ re_compiler_state<charT> &cstate)
	{
		if (curpos == end)
			this->throw_error(regex_constants::error_escape);

		atom.character = *curpos;

		switch (atom.character)
		{
		case meta_char::mc_minus:	//  '-'
			this->throw_error(regex_constants::error_escape);
			//@fallthrough@

		case char_alnum::ch_B:	//  'B':
			atom.is_not = true;
			//@fallthrough@

		case char_alnum::ch_b:	//  'b':
			atom.type   = st_boundary;	//  \b, \B.
			atom.quantifier.reset(0);
//			atom.number = 0;
			if (this->is_icase())
			{
				this->character_class.setup_icase_word();
				atom.number = static_cast<unsigned int>(re_character_class::icase_word);
			}
			else
				atom.number = static_cast<unsigned int>(re_character_class::word);	//  \w, \W.
			break;

//		case char_alnum::ch_A:	//  'A':
//			atom.type   = st_bol;	//  '\A'
//		case char_alnum::ch_Z:	//  'Z':
//			atom.type   = st_eol;	//  '\Z'
//		case char_alnum::ch_z:	//  'z':
//			atom.type   = st_eol;	//  '\z'

		//  Backreferences.

#if !defined(SRELL_NO_NAMEDCAPTURE)
		//  Prepared for named captures.
		case char_alnum::ch_k:	//  'k':
			return parse_backreference_name(atom, curpos, end, cstate);	//  \k.
#endif

		default:

			if (atom.character >= char_alnum::ch_1 && atom.character <= char_alnum::ch_9)	//  \1, \9.
				return parse_backreference_number(atom, curpos, end, cstate);

			return translate_escseq(atom, curpos, end) && register_if_negatedcharclass(atom);
		}

		++curpos;
		return true;
	}